

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_data.hpp
# Opt level: O0

void duckdb::ArrowScalarBaseData<int,_short,_duckdb::ArrowScalarConverter>::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  bool bVar1;
  int iVar2;
  UnifiedVectorFormat *this;
  short *psVar3;
  int *piVar4;
  idx_t iVar5;
  long lVar6;
  ulong idx;
  ulong in_RCX;
  ulong in_RDX;
  UnifiedVectorFormat *in_RSI;
  long *in_RDI;
  Vector *unaff_retaddr;
  idx_t result_idx;
  idx_t source_idx;
  idx_t i;
  int *result_data;
  short *data;
  ArrowBuffer *main_buffer;
  UnifiedVectorFormat format;
  idx_t size;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  UnifiedVectorFormat *this_00;
  idx_t in_stack_ffffffffffffff58;
  idx_t in_stack_ffffffffffffff60;
  UnifiedVectorFormat *in_stack_ffffffffffffff68;
  ArrowAppendData *in_stack_ffffffffffffff70;
  UnifiedVectorFormat local_78;
  long local_30;
  ulong local_20;
  ulong local_18;
  
  local_30 = in_RCX - in_RDX;
  local_20 = in_RCX;
  local_18 = in_RDX;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)in_RDI,in_RSI);
  AppendValidity(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
  this = (UnifiedVectorFormat *)ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x15369a6);
  this_00 = this;
  ArrowBuffer::size((ArrowBuffer *)this);
  ArrowBuffer::resize((ArrowBuffer *)this,
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  psVar3 = UnifiedVectorFormat::GetData<short>(&local_78);
  piVar4 = ArrowBuffer::GetData<int>((ArrowBuffer *)0x15369f7);
  for (idx = local_18; idx < local_20; idx = idx + 1) {
    iVar5 = SelectionVector::get_index(local_78.sel,idx);
    lVar6 = (*in_RDI + idx) - local_18;
    bVar1 = ArrowScalarConverter::SkipNulls();
    if ((!bVar1) ||
       (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)this_00,(idx_t)this), bVar1)) {
      iVar2 = ArrowScalarConverter::Operation<int,short>(psVar3[iVar5]);
      piVar4[lVar6] = iVar2;
    }
    else {
      ArrowScalarConverter::SetNull<int>(piVar4 + lVar6);
    }
  }
  *in_RDI = local_30 + *in_RDI;
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		D_ASSERT(to >= from);
		idx_t size = to - from;
		D_ASSERT(size <= input_size);
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);

		// append the validity mask
		AppendValidity(append_data, format, from, to);

		// append the main data
		auto &main_buffer = append_data.GetMainBuffer();
		main_buffer.resize(main_buffer.size() + sizeof(TGT) * size);
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto result_data = main_buffer.GetData<TGT>();

		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto result_idx = append_data.row_count + i - from;

			if (OP::SkipNulls() && !format.validity.RowIsValid(source_idx)) {
				OP::template SetNull<TGT>(result_data[result_idx]);
				continue;
			}
			result_data[result_idx] = OP::template Operation<TGT, SRC>(data[source_idx]);
		}
		append_data.row_count += size;
	}